

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test_add.cpp
# Opt level: O0

void add_test(void)

{
  ostream *this;
  exception *err;
  
  add_test_uint64_uint64();
  add_test_uint64_uint32();
  add_test_uint64_int64();
  add_test_uint64_int32();
  add_test_int64_uint64();
  add_test_int64_uint32();
  add_test_int64_int64();
  add_test_int64_int32();
  add_test_uint32_uint64();
  add_test_uint32_uint32();
  add_test_uint32_int64();
  add_test_uint32_int32();
  add_test_int32_uint64();
  add_test_int32_uint32();
  add_test_int32_int64();
  add_test_int32_int32();
  this = std::operator<<((ostream *)&std::cout,"Addition tests completed");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void add_test()
{
	try
	{
		add_test_uint64_uint64();
		add_test_uint64_uint32();
		add_test_uint64_int64();
		add_test_uint64_int32();

		add_test_int64_uint64();
		add_test_int64_uint32();
		add_test_int64_int64();
		add_test_int64_int32();

		add_test_uint32_uint64();
		add_test_uint32_uint32();
		add_test_uint32_int64();
		add_test_uint32_int32();

		add_test_int32_uint64();
		add_test_int32_uint32();
		add_test_int32_int64();
		add_test_int32_int32();

		std::cout << "Addition tests completed" << std::endl;
	}
	catch (std::exception& err)
	{
		std::cout << "Addition tests failed - " << err.what() << std::endl;
	}

	return;
}